

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sat.h
# Opt level: O1

string * getLitString_abi_cxx11_(string *__return_storage_ptr__,int n)

{
  ostream *poVar1;
  char *pcVar2;
  _Base_ptr p_Var3;
  char *pcVar4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  stringstream ss;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  if (lit_True.x != n) {
    if ((lit_False.x == n) || ((lit_True.x ^ n) == 1)) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar4 = "false";
      pcVar2 = "";
      goto LAB_001bc99c;
    }
    if ((lit_False.x ^ n) != 1) {
      p_Var6 = &litString_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header;
      p_Var3 = p_Var6;
      if (litString_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent !=
          (_Base_ptr)0x0) {
        p_Var3 = &litString_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header;
        p_Var5 = litString_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        do {
          if (n <= (int)p_Var5[1]._M_color) {
            p_Var3 = p_Var5;
          }
          p_Var5 = (&p_Var5->_M_left)[(int)p_Var5[1]._M_color < n];
        } while (p_Var5 != (_Base_ptr)0x0);
      }
      if (((_Rb_tree_header *)p_Var3 != &litString_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) &&
         (p_Var6 = &litString_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header,
         (int)p_Var3[1]._M_color <= n)) {
        p_Var6 = p_Var3;
      }
      if ((_Rb_tree_header *)p_Var6 != &litString_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)__return_storage_ptr__,p_Var6[1]._M_parent,
                   (long)&(p_Var6[1]._M_parent)->_M_color + (long)&(p_Var6[1]._M_left)->_M_color);
        return __return_storage_ptr__;
      }
      std::__cxx11::stringstream::stringstream(local_1a0);
      std::__ostream_insert<char,std::char_traits<char>>(local_190,"UNKNOWN_LITERAL (",0x11);
      poVar1 = (ostream *)std::ostream::operator<<((ostream *)local_190,n);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
      std::__cxx11::stringbuf::str();
      std::__cxx11::stringstream::~stringstream(local_1a0);
      std::ios_base::~ios_base(local_120);
      return __return_storage_ptr__;
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar4 = "true";
  pcVar2 = "";
LAB_001bc99c:
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar4,pcVar2);
  return __return_storage_ptr__;
}

Assistant:

inline std::string getLitString(int n) {
	if (n == toInt(lit_True)) {
		return "true";
	}
	if (n == toInt(lit_False)) {
		return "false";
	}
	if (n == toInt(~lit_True)) {
		return "false";
	}
	if (n == toInt(~lit_False)) {
		return "true";
	}
	const std::map<int, std::string>::const_iterator it = litString.find(n);
	if (it != litString.end()) {
		return it->second;
	}
	std::stringstream ss;
	ss << "UNKNOWN_LITERAL (" << n << ")";
	return ss.str();
}